

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::color4d> *value)

{
  bool bVar1;
  undefined1 local_48 [8];
  color4d v;
  optional<tinyusdz::value::color4d> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::color4d>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,(color4d *)local_48);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::color4d>::operator=
                (value,(color4d *)local_48);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::color4d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::color4d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}